

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O2

void writeAssemblyCode(char *filename,char *destdir,char *optEntryPoint,char *optFilename,
                      char *outFilePath)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  FileStream *fileStream;
  FileStream *fileStream_00;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint local_10c4;
  uint32_t *local_10c0;
  char entry [64];
  char local_1078;
  char local_1077 [63];
  uint32_t buffer [1024];
  
  fileStream = T_FileStream_open(filename,"rb");
  if (fileStream == (FileStream *)0x0) {
    pcVar5 = "genccode: unable to open input file %s\n";
  }
  else {
    getOutFilename(filename,destdir,(char *)buffer,entry,".S",optFilename);
    fileStream_00 = T_FileStream_open((char *)buffer,"w");
    if (fileStream_00 != (FileStream *)0x0) {
      if (outFilePath != (char *)0x0) {
        strcpy(outFilePath,(char *)buffer);
      }
      if (optEntryPoint != (char *)0x0) {
        strcpy(entry,optEntryPoint);
        sVar4 = strlen(entry);
        builtin_strncpy(entry + sVar4,"_dat",5);
      }
      sVar4 = strlen(entry);
      for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
        if ((byte)(entry[sVar7] - 0x2dU) < 2) {
          entry[sVar7] = '_';
        }
      }
      local_10c0 = (uint32_t *)filename;
      sprintf((char *)buffer,assemblyHeader[assemblyHeaderIndex].header,entry,entry,entry,entry,
              entry,entry,entry,entry);
      T_FileStream_writeLine(fileStream_00,(char *)buffer);
      T_FileStream_writeLine(fileStream_00,assemblyHeader[assemblyHeaderIndex].beginLine);
      uVar6 = 0xffffffff;
      do {
        uVar2 = T_FileStream_read(fileStream,buffer,0x1000);
        if (uVar2 != 0x1000) {
          if (uVar2 == 0) goto LAB_001e3cfe;
          for (uVar9 = 0; (uVar2 & 3) != uVar9; uVar9 = uVar9 + 1) {
            buffer[(long)(int)uVar2 + uVar9] = 0;
          }
        }
        for (uVar9 = 0; uVar9 != (ulong)(long)(int)uVar2 >> 2; uVar9 = uVar9 + 1) {
          uVar8 = buffer[uVar9];
          local_10c4 = uVar8;
          pcVar5 = &local_1078;
          uVar11 = 1;
          uVar10 = uVar11;
          if (uVar6 != 0xffffffff) {
            if (uVar6 < 0x20) {
              local_1078 = ',';
              pcVar5 = local_1077;
              uVar10 = uVar6 + 1;
            }
            else {
              local_1078 = '\n';
              strcpy(local_1077,assemblyHeader[assemblyHeaderIndex].beginLine);
              sVar4 = strlen(local_1077);
              pcVar5 = local_1077 + sVar4;
            }
          }
          if (uVar8 < 10) {
            *pcVar5 = (&write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr)[uVar8];
            pcVar5 = pcVar5 + 1;
          }
          else {
            if (hexType == 1) {
              *pcVar5 = '0';
              pcVar5 = pcVar5 + 1;
            }
            else if (hexType == 0) {
              pcVar5[0] = '0';
              pcVar5[1] = 'x';
              pcVar5 = pcVar5 + 2;
            }
            uVar8 = 0;
            for (uVar6 = 3; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
              bVar1 = *(byte *)((long)&local_10c4 + (ulong)uVar6);
              if ((uVar8 != 0) || (uVar8 = 0, bVar1 != 0)) {
                *pcVar5 = (&write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr)[bVar1 >> 4];
                pcVar5[1] = (&write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr)
                            [bVar1 & 0xf];
                pcVar5 = pcVar5 + 2;
                uVar8 = uVar11;
              }
            }
            if (hexType == 1) {
              *pcVar5 = 'h';
              pcVar5 = pcVar5 + 1;
            }
          }
          *pcVar5 = '\0';
          T_FileStream_writeLine(fileStream_00,&local_1078);
          uVar6 = uVar10;
        }
      } while( true );
    }
    pcVar5 = "genccode: unable to open output file %s\n";
    filename = (char *)buffer;
  }
LAB_001e3df4:
  fprintf(_stderr,pcVar5,filename);
  exit(4);
LAB_001e3cfe:
  T_FileStream_writeLine(fileStream_00,"\n");
  sprintf((char *)buffer,assemblyHeader[assemblyHeaderIndex].footer,entry,entry,entry,entry,entry,
          entry,entry,entry);
  T_FileStream_writeLine(fileStream_00,(char *)buffer);
  iVar3 = T_FileStream_error(fileStream);
  if (iVar3 == 0) {
    iVar3 = T_FileStream_error(fileStream_00);
    if (iVar3 == 0) {
      T_FileStream_close(fileStream_00);
      T_FileStream_close(fileStream);
      return;
    }
    pcVar5 = "genccode: file write error while generating from file %s\n";
    filename = (char *)local_10c0;
  }
  else {
    pcVar5 = "genccode: file read error while generating from file %s\n";
    filename = (char *)local_10c0;
  }
  goto LAB_001e3df4;
}

Assistant:

U_CAPI void U_EXPORT2
writeAssemblyCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optFilename, char *outFilePath) {
    uint32_t column = MAX_COLUMN;
    char entry[64];
    uint32_t buffer[1024];
    char *bufferStr = (char *)buffer;
    FileStream *in, *out;
    size_t i, length;

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    getOutFilename(filename, destdir, bufferStr, entry, ".S", optFilename);
    out=T_FileStream_open(bufferStr, "w");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", bufferStr);
        exit(U_FILE_ACCESS_ERROR);
    }

    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, bufferStr);
    }

#if defined (WINDOWS_WITH_GNUC) && U_PLATFORM != U_PF_CYGWIN
    /* Need to fix the file separator character when using MinGW. */
    swapFileSepChar(outFilePath, U_FILE_SEP_CHAR, '/');
#endif

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry, optEntryPoint);
        uprv_strcat(entry, "_dat");
    }

    /* turn dashes or dots in the entry name into underscores */
    length=uprv_strlen(entry);
    for(i=0; i<length; ++i) {
        if(entry[i]=='-' || entry[i]=='.') {
            entry[i]='_';
        }
    }

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].header,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);
    T_FileStream_writeLine(out, assemblyHeader[assemblyHeaderIndex].beginLine);

    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        if (length != sizeof(buffer)) {
            /* pad with extra 0's when at the end of the file */
            for(i=0; i < (length % sizeof(uint32_t)); ++i) {
                buffer[length+i] = 0;
            }
        }
        for(i=0; i<(length/sizeof(buffer[0])); i++) {
            column = write32(out, buffer[i], column);
        }
    }

    T_FileStream_writeLine(out, "\n");

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].footer,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}